

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_validateConnectionsWithBaseUnits_Test::~Units_validateConnectionsWithBaseUnits_Test
          (Units_validateConnectionsWithBaseUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, validateConnectionsWithBaseUnits)
{
    const std::string m =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base_units_test\">\n"
        "  <units name=\"cells\"/>\n"
        "  <component name=\"c1\">\n"
        "    <variable name=\"c1_v\" units=\"cells\" initial_value=\"100\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <component name=\"c2\">\n"
        "    <variable name=\"c2_v\" units=\"cells\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"c1\" component_2=\"c2\">\n"
        "    <map_variables variable_1=\"c1_v\" variable_2=\"c2_v\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(m);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
}